

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNewInputFromUrl(void)

{
  int iVar1;
  xmlParserInputFlags val;
  xmlParserErrors val_00;
  int iVar2;
  char *val_01;
  int local_3c;
  int n_out;
  xmlParserInputPtr *out;
  int n_flags;
  xmlParserInputFlags flags;
  int n_filename;
  char *filename;
  xmlParserErrors ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = XML_ERR_OK;
  for (n_flags = 0; n_flags < 8; n_flags = n_flags + 1) {
    for (out._4_4_ = 0; (int)out._4_4_ < 4; out._4_4_ = out._4_4_ + 1) {
      for (local_3c = 0; local_3c < 1; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val_01 = gen_filepath(n_flags,0);
        val = gen_xmlParserInputFlags(out._4_4_,1);
        val_00 = xmlNewInputFromUrl(val_01,val,0);
        desret_xmlParserErrors(val_00);
        call_tests = call_tests + 1;
        des_filepath(n_flags,val_01,0);
        des_xmlParserInputFlags(out._4_4_,val,1);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewInputFromUrl",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + XML_ERR_INTERNAL_ERROR;
          printf(" %d",(ulong)(uint)n_flags);
          printf(" %d",(ulong)out._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlNewInputFromUrl(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserErrors ret_val;
    const char * filename; /* the filename to use as entity */
    int n_filename;
    xmlParserInputFlags flags; /* XML_INPUT flags */
    int n_flags;
    xmlParserInputPtr * out; /* pointer to new parser input */
    int n_out;

    for (n_filename = 0;n_filename < gen_nb_filepath;n_filename++) {
    for (n_flags = 0;n_flags < gen_nb_xmlParserInputFlags;n_flags++) {
    for (n_out = 0;n_out < gen_nb_xmlParserInputPtr_ptr;n_out++) {
        mem_base = xmlMemBlocks();
        filename = gen_filepath(n_filename, 0);
        flags = gen_xmlParserInputFlags(n_flags, 1);
        out = gen_xmlParserInputPtr_ptr(n_out, 2);

        ret_val = xmlNewInputFromUrl(filename, flags, out);
        desret_xmlParserErrors(ret_val);
        call_tests++;
        des_filepath(n_filename, filename, 0);
        des_xmlParserInputFlags(n_flags, flags, 1);
        des_xmlParserInputPtr_ptr(n_out, out, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNewInputFromUrl",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_filename);
            printf(" %d", n_flags);
            printf(" %d", n_out);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}